

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
::do_get_arg(format_arg *__return_storage_ptr__,
            context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            *this,uint arg_id)

{
  bool bVar1;
  format_arg *arg;
  uint arg_id_local;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *this_local;
  
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::get(__return_storage_ptr__,&this->args_,arg_id);
  bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)__return_storage_ptr__);
  if (!bVar1) {
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              (&this->parse_context_,"argument index out of range");
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get_arg(unsigned arg_id) {
    format_arg arg = args_.get(arg_id);
    if (!arg)
      parse_context_.on_error("argument index out of range");
    return arg;
  }